

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveArea.cpp
# Opt level: O3

void __thiscall CDirectiveArea::writeTempData(CDirectiveArea *this,TempData *tempData)

{
  int64_t iVar1;
  CAssemblerCommand *pCVar2;
  long lVar3;
  byte bVar4;
  long lVar5;
  int64_t *args;
  int8_t *args_00;
  int8_t *in_R8;
  char *in_R9;
  string fillString;
  char *directiveType;
  int64_t subAreaUsage;
  string local_70;
  char *local_50;
  int64_t local_48;
  string local_40;
  
  bVar4 = (this->super_CAssemblerCommand).field_0x14;
  local_50 = ".area";
  if (bVar4 != 0) {
    local_50 = ".region";
  }
  local_50 = local_50 + 1;
  if ((this->positionExpression).expression.
      super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    iVar1 = this->position;
    tinyformat::format<long>(&local_70,".org 0x%08llX",&this->position);
    TempData::writeLine(tempData,iVar1,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    bVar4 = (this->super_CAssemblerCommand).field_0x14;
  }
  iVar1 = this->position;
  args = &this->areaSize;
  if (((bVar4 & 1) == 0) ||
     ((this->fillExpression).expression.
      super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0)) {
    tinyformat::format<char_const*,long>
              (&local_70,(tinyformat *)".%S 0x%08X",(char *)&local_50,(char **)args,(long *)in_R8);
    TempData::writeLine(tempData,iVar1,&local_70);
  }
  else {
    in_R8 = &this->fillValue;
    tinyformat::format<char_const*,long,signed_char>
              (&local_70,(tinyformat *)".%S 0x%08X,0x%02x",(char *)&local_50,(char **)args,
               (long *)in_R8,in_R9);
    TempData::writeLine(tempData,iVar1,&local_70);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  pCVar2 = (this->content)._M_t.
           super___uniq_ptr_impl<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>._M_t.
           super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>.
           super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl;
  if (pCVar2 != (CAssemblerCommand *)0x0) {
    CAssemblerCommand::applyFileInfo(pCVar2);
    pCVar2 = (this->content)._M_t.
             super___uniq_ptr_impl<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>._M_t.
             super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>.
             super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl;
    (*pCVar2->_vptr_CAssemblerCommand[4])(pCVar2,tempData);
  }
  if (((this->fillExpression).expression.
       super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
       (element_type *)0x0) || ((this->super_CAssemblerCommand).field_0x14 != '\0')) {
    lVar5 = this->contentSize;
    lVar3 = this->position;
    tinyformat::format<char_const*>
              (&local_70,(tinyformat *)".end%S",(char *)&local_50,(char **)args);
    TempData::writeLine(tempData,lVar5 + lVar3,&local_70);
  }
  else {
    local_48 = Allocations::getSubAreaUsage(this->fileID,this->position);
    if (local_48 == 0) {
      lVar5 = 0;
    }
    else {
      lVar5 = this->contentSize;
      lVar3 = this->position;
      tinyformat::format<long>(&local_70,".skip 0x%08llX",&local_48);
      TempData::writeLine(tempData,lVar5 + lVar3,&local_70);
      lVar5 = local_48;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        lVar5 = local_48;
      }
    }
    local_40._M_dataplus._M_p = (pointer)(this->areaSize - (lVar5 + this->contentSize));
    args_00 = &this->fillValue;
    tinyformat::format<long,signed_char>
              (&local_70,(tinyformat *)".fill 0x%08X,0x%02X",(char *)&local_40,(long *)args_00,in_R8
              );
    TempData::writeLine(tempData,this->contentSize + this->position + local_48,&local_70);
    lVar5 = this->position;
    lVar3 = this->areaSize;
    tinyformat::format<char_const*>
              (&local_40,(tinyformat *)".end%S",(char *)&local_50,(char **)args_00);
    TempData::writeLine(tempData,lVar3 + lVar5,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void CDirectiveArea::writeTempData(TempData& tempData) const
{
	const char *directiveType = shared ? "region" : "area";
	if (positionExpression.isLoaded())
		tempData.writeLine(position, tfm::format(".org 0x%08llX", position));
	if (shared && fillExpression.isLoaded())
		tempData.writeLine(position,tfm::format(".%S 0x%08X,0x%02x",directiveType,areaSize,fillValue));
	else
		tempData.writeLine(position,tfm::format(".%S 0x%08X",directiveType,areaSize));
	if (content)
	{
		content->applyFileInfo();
		content->writeTempData(tempData);
	}

	if (fillExpression.isLoaded() && !shared)
	{
		int64_t subAreaUsage = Allocations::getSubAreaUsage(fileID, position);
		if (subAreaUsage != 0)
			tempData.writeLine(position+contentSize, tfm::format(".skip 0x%08llX",subAreaUsage));

		std::string fillString = tfm::format(".fill 0x%08X,0x%02X",areaSize-contentSize-subAreaUsage,fillValue);
		tempData.writeLine(position+contentSize+subAreaUsage,fillString);
		tempData.writeLine(position+areaSize,tfm::format(".end%S",directiveType));
	} else {
		tempData.writeLine(position+contentSize,tfm::format(".end%S",directiveType));
	}
}